

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void tlstran_pipe_recv_cb(void *arg)

{
  nni_aio *aio;
  nni_msg **mp;
  nni_msg *pnVar1;
  undefined8 uVar2;
  nng_err result;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  nni_aio *aio_00;
  size_t sVar6;
  nni_mtx *mtx;
  ulong sz;
  undefined1 local_110 [8];
  nng_sockaddr_storage ss;
  char peername [64];
  
  aio = (nni_aio *)((long)arg + 0x268);
  mtx = (nni_mtx *)((long)arg + 0x600);
  nni_mtx_lock(mtx);
  aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x50));
  result = nni_aio_result(aio);
  if (result == NNG_OK) {
    sVar6 = nni_aio_count(aio);
    nni_aio_iov_advance(aio,sVar6);
    sVar6 = nni_aio_iov_count(aio);
    if (sVar6 != 0) {
      nng_stream_recv(*arg,aio);
      nni_mtx_unlock(mtx);
      return;
    }
    mp = (nni_msg **)((long)arg + 0x5f8);
    if (*(long *)((long)arg + 0x5f8) != 0) {
LAB_00124983:
      nni_aio_list_remove(aio_00);
      pnVar1 = *mp;
      *mp = (nni_msg *)0x0;
      sVar6 = nni_msg_len(pnVar1);
      iVar3 = nni_list_empty((nni_list *)((long)arg + 0x50));
      if (iVar3 == 0) {
        tlstran_pipe_recv_start((tlstran_pipe *)arg);
      }
      nni_pipe_bump_rx(*(nni_pipe **)((long)arg + 8),sVar6);
      nni_mtx_unlock(mtx);
      nni_aio_set_msg(aio_00,pnVar1);
      nni_aio_finish_sync(aio_00,NNG_OK,sVar6);
      return;
    }
    sz = (ulong)*(byte *)((long)arg + 0x7f) +
         ((ulong)*(byte *)((long)arg + 0x7e) << 8 |
         (ulong)*(byte *)((long)arg + 0x7d) << 0x10 |
         (ulong)(uint)(*(int *)((long)arg + 0x7c) << 0x18) |
         (ulong)*(byte *)((long)arg + 0x7b) << 0x20 |
         (ulong)*(byte *)((long)arg + 0x7a) << 0x28 |
         (ulong)*(byte *)((long)arg + 0x79) << 0x30 | (ulong)*(uint *)((long)arg + 0x78) << 0x38);
    if ((*(ulong *)((long)arg + 0x18) == 0) || (sz <= *(ulong *)((long)arg + 0x18))) {
      result = nni_msg_alloc(mp,sz);
      if (result == NNG_OK) {
        if (sz != 0) {
          local_110 = (undefined1  [8])nni_msg_body(*(nni_msg **)((long)arg + 0x5f8));
          ss._0_8_ = sz;
          nni_aio_set_iov(aio,1,(nni_iov *)local_110);
          nng_stream_recv(*arg,aio);
          nni_mtx_unlock(mtx);
          return;
        }
        goto LAB_00124983;
      }
    }
    else {
      ss.sa_pad[0xf]._0_1_ = 'u';
      ss.sa_pad[0xf]._1_1_ = 'n';
      ss.sa_pad[0xf]._2_1_ = 'k';
      ss.sa_pad[0xf]._3_1_ = 'n';
      ss.sa_pad[0xf]._4_1_ = 'o';
      ss.sa_pad[0xf]._5_1_ = 'w';
      ss.sa_pad[0xf]._6_1_ = 'n';
      ss.sa_pad[0xf]._7_1_ = '\0';
      iVar3 = nng_stream_get_addr(*arg,"remote-address",(nng_sockaddr *)local_110);
      if (iVar3 == 0) {
        nng_str_sockaddr((nng_sockaddr *)local_110,(char *)(ss.sa_pad + 0xf),0x40);
      }
      uVar2 = *(undefined8 *)((long)arg + 0x18);
      uVar4 = nni_pipe_sock_id(*(nni_pipe **)((long)arg + 8));
      uVar5 = nni_pipe_id(*(nni_pipe **)((long)arg + 8));
      nng_log_warn("NNG-RCVMAX",
                   "Oversize message of %lu bytes (> %lu) on socket<%u> pipe<%u> from TLS %s",sz,
                   uVar2,(ulong)uVar4,(ulong)uVar5,ss.sa_pad + 0xf);
      result = NNG_EMSGSIZE;
    }
  }
  nni_aio_list_remove(aio_00);
  pnVar1 = *(nni_msg **)((long)arg + 0x5f8);
  *(undefined8 *)((long)arg + 0x5f8) = 0;
  nni_pipe_bump_error(*(nni_pipe **)((long)arg + 8),result);
  nni_mtx_unlock(mtx);
  nni_msg_free(pnVar1);
  nni_aio_finish_error(aio_00,result);
  return;
}

Assistant:

static void
tlstran_pipe_recv_cb(void *arg)
{
	tlstran_pipe *p = arg;
	nni_aio      *aio;
	int           rv;
	size_t        n;
	nni_msg      *msg;
	nni_aio      *rxaio = &p->rxaio;

	nni_mtx_lock(&p->mtx);
	aio = nni_list_first(&p->recvq);

	if ((rv = nni_aio_result(rxaio)) != 0) {
		goto recv_error;
	}

	n = nni_aio_count(rxaio);
	nni_aio_iov_advance(rxaio, n);
	if (nni_aio_iov_count(rxaio) > 0) {
		// Was this a partial read?  If so then resubmit for the rest.
		nng_stream_recv(p->tls, rxaio);
		nni_mtx_unlock(&p->mtx);
		return;
	}

	// If we don't have a message yet, we were reading the TCP message
	// header, which is just the length.  This tells us the size of the
	// message to allocate and how much more to expect.
	if (p->rxmsg == NULL) {
		uint64_t len;
		// We should have gotten a message header.
		NNI_GET64(p->rxlen, len);

		// Make sure the message payload is not too big.  If it is
		// the caller will shut down the pipe.
		if ((len > p->rcvmax) && (p->rcvmax > 0)) {
			nng_sockaddr_storage ss;
			nng_sockaddr        *sa = (nng_sockaddr *) &ss;
			char                 peername[64] = "unknown";
			if ((rv = nng_stream_get_addr(
			         p->tls, NNG_OPT_REMADDR, sa)) == 0) {
				(void) nng_str_sockaddr(
				    sa, peername, sizeof(peername));
			}
			nng_log_warn("NNG-RCVMAX",
			    "Oversize message of %lu bytes (> %lu) "
			    "on socket<%u> pipe<%u> from TLS %s",
			    (unsigned long) len, (unsigned long) p->rcvmax,
			    nni_pipe_sock_id(p->npipe), nni_pipe_id(p->npipe),
			    peername);
			rv = NNG_EMSGSIZE;
			goto recv_error;
		}

		if ((rv = nni_msg_alloc(&p->rxmsg, (size_t) len)) != 0) {
			goto recv_error;
		}

		// Submit the rest of the data for a read -- we want to
		// read the entire message now.
		if (len != 0) {
			nni_iov iov;
			iov.iov_buf = nni_msg_body(p->rxmsg);
			iov.iov_len = (size_t) len;
			nni_aio_set_iov(rxaio, 1, &iov);

			nng_stream_recv(p->tls, rxaio);
			nni_mtx_unlock(&p->mtx);
			return;
		}
	}

	// We read a message completely.  Let the user know the good news.
	nni_aio_list_remove(aio);
	msg      = p->rxmsg;
	p->rxmsg = NULL;
	n        = nni_msg_len(msg);
	if (!nni_list_empty(&p->recvq)) {
		tlstran_pipe_recv_start(p);
	}
	nni_pipe_bump_rx(p->npipe, n);
	nni_mtx_unlock(&p->mtx);

	nni_aio_set_msg(aio, msg);
	nni_aio_finish_sync(aio, 0, n);
	return;

recv_error:
	nni_aio_list_remove(aio);
	msg      = p->rxmsg;
	p->rxmsg = NULL;
	nni_pipe_bump_error(p->npipe, rv);
	// Intentionally, we do not queue up another receive.
	// The protocol should notice this error and close the pipe.
	nni_mtx_unlock(&p->mtx);
	nni_msg_free(msg);
	nni_aio_finish_error(aio, rv);
}